

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O1

void __thiscall
amrex::MLNodeLaplacian::Fapply
          (MLNodeLaplacian *this,int amrlev,int mglev,MultiFab *out,MultiFab *in)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  uint uVar28;
  long *plVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  bool bVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  Real f2x2ymz;
  Real f2xmy2z;
  Real fm2xm2y4z;
  Real fm2x4ym2z;
  Real f4xm2ym2z;
  Real fmx2y2z;
  Real fxyz;
  Real facy;
  Real facx;
  Real facz;
  MFIter mfi;
  int *local_5e8;
  ulong local_588;
  Box local_50c;
  ulong local_4f0;
  long local_4e8;
  long local_4e0;
  double *local_4d8;
  undefined8 uStack_4d0;
  long local_4c0;
  long local_4b8;
  int local_4ac;
  int local_4a8;
  uint local_4a4;
  int local_4a0;
  int local_49c;
  int *local_498;
  undefined8 uStack_490;
  MLNodeLaplacian *local_488;
  ulong local_480;
  long local_478;
  ulong local_470;
  long *local_468;
  long local_460;
  ulong local_458;
  long local_450;
  long local_448;
  long local_440;
  long local_438;
  long local_430;
  int *local_428;
  double *local_420;
  long local_418;
  long local_410;
  long local_408;
  long local_400;
  long local_3f8;
  long local_3f0;
  long local_3e8;
  int local_3e0;
  int local_3dc;
  int local_3d8;
  uint local_3d4;
  int local_3d0;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  Array4<const_int> local_3c0;
  Array4<double> local_380;
  Array4<const_double> local_340;
  ulong local_300;
  Array4<const_double> local_2f8;
  double local_2b8;
  undefined8 uStack_2b0;
  double local_2a8;
  undefined8 uStack_2a0;
  double local_298;
  undefined8 uStack_290;
  long local_288;
  long local_280;
  FabArray<amrex::IArrayBox> *local_278;
  FabArray<amrex::FArrayBox> *local_270;
  FabArray<amrex::FArrayBox> *local_268;
  long local_260;
  int *local_258;
  double *local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  double *local_210;
  double *local_208;
  double *local_200;
  ulong local_1f8;
  long local_1f0;
  double local_1e8;
  undefined8 uStack_1e0;
  double local_1d8;
  undefined8 uStack_1d0;
  double local_1c8;
  undefined8 uStack_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 uStack_170;
  double local_168;
  undefined8 uStack_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  undefined8 uStack_120;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  local_280 = (long)mglev;
  local_468 = (long *)(local_280 * 0x18 +
                      *(long *)&(this->m_sigma).
                                super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                                .
                                super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                      );
  local_288 = *(long *)&(this->m_stencil).
                        super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ;
  lVar51 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar50 = local_280 * 200;
  dVar78 = *(double *)(lVar51 + 0x38 + lVar50);
  dVar74 = *(double *)(lVar51 + 0x40 + lVar50);
  dVar3 = *(double *)(lVar51 + 0x48 + lVar50);
  local_278 = *(FabArray<amrex::IArrayBox> **)
               (*(long *)&(this->super_MLNodeLinOp).m_dirichlet_mask.
                          super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[amrlev].
                          super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                          .
                          super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               + local_280 * 8);
  local_488 = this;
  local_3e0 = mglev;
  local_270 = &out->super_FabArray<amrex::FArrayBox>;
  local_268 = &in->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&local_90,(FabArrayBase *)out,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_138 = dVar78 * 0.027777777777777776 * dVar78;
    local_148 = dVar74 * 0.027777777777777776 * dVar74;
    local_128 = dVar3 * 0.027777777777777776 * dVar3;
    local_188 = local_138 + local_148 + local_128;
    uStack_180 = 0;
    local_298 = -local_138;
    uStack_290 = 0x8000000000000000;
    local_2a8 = local_148 + local_148;
    local_2b8 = local_128 + local_128;
    local_198 = (local_2a8 - local_138) + local_2b8;
    uStack_190 = 0;
    local_168 = -local_148;
    uStack_160 = 0x8000000000000000;
    local_178 = local_138 + local_138;
    local_1a8 = (local_138 * 4.0 - local_2a8) + local_128 * -2.0;
    uStack_1a0 = 0;
    uStack_130 = 0;
    local_1b8 = local_148 * 4.0 + local_138 * -2.0 + local_128 * -2.0;
    uStack_1b0 = 0;
    local_1c8 = local_128 * 4.0 + (local_138 * -2.0 - local_2a8);
    uStack_1c0 = 0;
    uStack_140 = 0;
    uStack_2b0 = 0;
    local_1d8 = (local_178 - local_148) + local_2b8;
    uStack_1d0 = 0;
    uStack_170 = 0;
    uStack_2a0 = 0;
    local_1e8 = (local_178 + local_2a8) - local_128;
    uStack_1e0 = 0;
    uStack_120 = 0;
    local_158 = -local_128;
    uStack_150 = 0x8000000000000000;
    do {
      MFIter::tilebox(&local_50c,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_340,local_268,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_380,local_270,&local_90);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_3c0,local_278,&local_90);
      plVar29 = local_468;
      if ((local_488->super_MLNodeLinOp).m_coarsening_strategy == RAP) {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_2f8,*(FabArray<amrex::FArrayBox> **)(local_288 + local_280 * 8),&local_90)
        ;
        local_438 = CONCAT44(local_438._4_4_,local_50c.bigend.vect[2]);
        local_4f0 = (ulong)(uint)local_50c.smallend.vect[2];
        if (local_50c.smallend.vect[2] <= local_50c.bigend.vect[2]) {
          local_470 = (ulong)(uint)local_50c.smallend.vect[1];
          lVar51 = (long)local_50c.smallend.vect[0];
          local_430 = CONCAT44(local_430._4_4_,local_50c.smallend.vect[0] + 1);
          local_4e8 = lVar51 * 8;
          local_478 = CONCAT44(local_478._4_4_,local_50c.smallend.vect[2] - 1);
          local_440 = CONCAT44(local_440._4_4_,local_50c.smallend.vect[1] - 1U);
          local_4e0 = CONCAT44(local_4e0._4_4_,local_50c.smallend.vect[2] + 1);
          local_448 = CONCAT44(local_448._4_4_,local_50c.smallend.vect[1] + 1U);
          local_450 = lVar51 * 4;
          do {
            if (local_50c.smallend.vect[1] <= local_50c.bigend.vect[1]) {
              local_4c0 = (long)(int)local_478;
              local_3e8 = (long)(int)(uint)local_4f0;
              local_3f0 = CONCAT44(local_3f0._4_4_,(uint)local_4f0 - 1);
              local_3f8 = CONCAT44(local_3f8._4_4_,(uint)local_4f0 + 1);
              local_420 = local_380.p +
                          lVar51 + ((local_3e8 - local_380.begin.z) * local_380.kstride -
                                   (long)local_380.begin.x);
              local_418 = local_380.jstride * 8;
              local_410 = -(long)local_380.begin.y;
              local_428 = local_3c0.p +
                          lVar51 + ((local_3e8 - local_3c0.begin.z) * local_3c0.kstride -
                                   (long)local_3c0.begin.x);
              local_408 = local_3c0.jstride * 4;
              local_400 = -(long)local_3c0.begin.y;
              local_4d8 = (double *)CONCAT44(local_4d8._4_4_,local_50c.smallend.vect[1] + 1U);
              local_498 = (int *)CONCAT44(local_498._4_4_,local_50c.smallend.vect[1] - 1U);
              local_588 = local_470;
              do {
                if (local_50c.smallend.vect[0] <= local_50c.bigend.vect[0]) {
                  lVar61 = (long)(int)(uint)local_588;
                  iVar30 = (uint)local_588 - local_340.begin.y;
                  lVar33 = (local_4c0 - local_2f8.begin.z) * local_2f8.kstride * 8;
                  lVar38 = ((long)(int)local_498 - (long)local_2f8.begin.y) * local_2f8.jstride * 8;
                  lVar50 = lVar33 + lVar38;
                  lVar45 = (local_3e8 - local_2f8.begin.z) * local_2f8.kstride * 8;
                  lVar38 = lVar38 + lVar45;
                  lVar39 = (lVar61 - local_2f8.begin.y) * local_2f8.jstride * 8;
                  lVar33 = lVar33 + lVar39;
                  lVar39 = lVar39 + lVar45;
                  lVar64 = (int)((uint)local_4f0 - local_340.begin.z) * local_340.kstride;
                  lVar34 = (int)(((uint)local_4f0 - 1) - local_340.begin.z) * local_340.kstride;
                  lVar35 = (int)(((uint)local_4f0 + 1) - local_340.begin.z) * local_340.kstride;
                  lVar44 = local_340.kstride * 8;
                  lVar62 = ((int)local_4e0 - local_340.begin.z) * lVar44;
                  lVar40 = (local_4c0 - local_340.begin.z) * lVar44;
                  lVar44 = (local_3e8 - local_340.begin.z) * lVar44;
                  local_4b8 = local_400 + lVar61;
                  lVar60 = local_340.jstride * iVar30;
                  lVar52 = (iVar30 + -1) * local_340.jstride;
                  lVar54 = (iVar30 + 1) * local_340.jstride;
                  lVar46 = local_340.jstride * 8;
                  lVar45 = (int)((uint)local_4d8 - local_340.begin.y) * lVar46;
                  lVar65 = ((long)(int)local_498 - (long)local_340.begin.y) * lVar46;
                  lVar46 = (lVar61 - local_340.begin.y) * lVar46;
                  lVar55 = (long)local_340.begin.x;
                  lVar49 = lVar62 + lVar45 + lVar55 * -8 + local_4e8;
                  lVar53 = lVar40 + lVar45 + lVar55 * -8 + local_4e8;
                  lVar58 = lVar45 + lVar44 + lVar55 * -8 + local_4e8;
                  lVar63 = lVar65 + lVar62 + lVar55 * -8 + local_4e8;
                  lVar66 = lVar40 + lVar65 + lVar55 * -8 + local_4e8;
                  lVar65 = lVar65 + lVar44 + lVar55 * -8 + local_4e8;
                  lVar62 = lVar62 + lVar46 + lVar55 * -8 + local_4e8;
                  lVar40 = lVar40 + lVar46 + lVar55 * -8 + local_4e8;
                  lVar44 = lVar46 + lVar44 + lVar55 * -8 + local_4e8;
                  lVar56 = (long)local_2f8.begin.x;
                  lVar59 = local_2f8.nstride * 0x38;
                  lVar45 = local_2f8.nstride * 0x30;
                  lVar46 = lVar50 + lVar59 + lVar56 * -8 + local_4e8;
                  lVar55 = lVar38 + lVar59 + lVar56 * -8 + local_4e8;
                  lVar67 = lVar38 + local_2f8.nstride * 0x20 + lVar56 * -8 + local_4e8;
                  lVar41 = lVar33 + lVar59 + lVar56 * -8 + local_4e8;
                  lVar36 = lVar33 + local_2f8.nstride * 0x28 + lVar56 * -8 + local_4e8;
                  lVar59 = lVar59 + lVar39 + lVar56 * -8 + local_4e8;
                  lVar42 = local_2f8.nstride * 0x28 + lVar39 + lVar56 * -8 + local_4e8;
                  lVar43 = local_2f8.nstride * 0x20 + lVar39 + lVar56 * -8 + local_4e8;
                  lVar47 = lVar39 + local_2f8.nstride * 8 + lVar56 * -8 + local_4e8;
                  lVar57 = 0;
                  do {
                    dVar78 = 0.0;
                    if (*(int *)((long)local_428 + lVar57 * 4 + local_4b8 * local_408) == 0) {
                      lVar48 = (long)(((local_50c.smallend.vect[0] + 1) - local_340.begin.x) +
                                     (int)lVar57);
                      dVar78 = local_340.p[lVar54 + lVar48 + lVar35] *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar59) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar49 + -8) *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar59 + -8) +
                               local_340.p[lVar52 + lVar48 + lVar35] *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar55) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar63 + -8) *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar55 + -8) +
                               local_340.p[lVar54 + lVar48 + lVar34] *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar41) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar53 + -8) *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar41 + -8) +
                               local_340.p[lVar52 + lVar48 + lVar34] *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar46) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar66 + -8) *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar46 + -8) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar49) *
                               *(double *)
                                ((long)local_2f8.p +
                                lVar57 * 8 + lVar45 + lVar39 + lVar56 * -8 + local_4e8) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar63) *
                               *(double *)
                                ((long)local_2f8.p +
                                lVar57 * 8 + lVar38 + lVar45 + lVar56 * -8 + local_4e8) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar53) *
                               *(double *)
                                ((long)local_2f8.p +
                                lVar57 * 8 + lVar33 + lVar45 + lVar56 * -8 + local_4e8) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar66) *
                               *(double *)
                                ((long)local_2f8.p +
                                lVar57 * 8 + lVar50 + lVar45 + lVar56 * -8 + local_4e8) +
                               local_340.p[lVar60 + lVar48 + lVar35] *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar42) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar62 + -8) *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar42 + -8) +
                               local_340.p[lVar60 + lVar48 + lVar34] *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar36) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar40 + -8) *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar36 + -8) +
                               local_340.p[lVar54 + lVar48 + lVar64] *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar43) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar58 + -8) *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar43 + -8) +
                               local_340.p[lVar52 + lVar48 + lVar64] *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar67) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar65 + -8) *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar67 + -8) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar62) *
                               *(double *)
                                ((long)local_2f8.p +
                                lVar57 * 8 +
                                local_2f8.nstride * 0x18 + lVar39 + lVar56 * -8 + local_4e8) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar40) *
                               *(double *)
                                ((long)local_2f8.p +
                                lVar57 * 8 +
                                lVar33 + local_2f8.nstride * 0x18 + lVar56 * -8 + local_4e8) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar58) *
                               *(double *)
                                ((long)local_2f8.p +
                                lVar57 * 8 +
                                local_2f8.nstride * 0x10 + lVar39 + lVar56 * -8 + local_4e8) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar65) *
                               *(double *)
                                ((long)local_2f8.p +
                                lVar57 * 8 +
                                lVar38 + local_2f8.nstride * 0x10 + lVar56 * -8 + local_4e8) +
                               local_340.p[lVar60 + lVar48 + lVar64] *
                               *(double *)((long)local_2f8.p + lVar57 * 8 + lVar47) +
                               *(double *)((long)local_340.p + lVar57 * 8 + lVar44) *
                               *(double *)
                                ((long)local_2f8.p + lVar57 * 8 + lVar39 + lVar56 * -8 + local_4e8)
                               + *(double *)((long)local_340.p + lVar57 * 8 + lVar44 + -8) *
                                 *(double *)((long)local_2f8.p + lVar57 * 8 + lVar47 + -8);
                    }
                    *(double *)((long)local_420 + lVar57 * 8 + (local_410 + lVar61) * local_418) =
                         dVar78;
                    lVar57 = lVar57 + 1;
                  } while ((local_50c.bigend.vect[0] - local_50c.smallend.vect[0]) + 1 !=
                           (int)lVar57);
                }
                local_498 = (int *)CONCAT44(local_498._4_4_,(int)local_498 + 1);
                local_4d8 = (double *)CONCAT44(local_4d8._4_4_,(uint)local_4d8 + 1);
                bVar68 = (uint)local_588 != local_50c.bigend.vect[1];
                local_588 = (ulong)((uint)local_588 + 1);
              } while (bVar68);
            }
            uVar31 = (uint)local_4f0 + 1;
            local_478 = CONCAT44(local_478._4_4_,(int)local_478 + 1);
            local_4e0 = CONCAT44(local_4e0._4_4_,(int)local_4e0 + 1);
            bVar68 = (uint)local_4f0 != local_50c.bigend.vect[2];
            local_4f0 = (ulong)uVar31;
          } while (bVar68);
        }
      }
      else if (*local_468 == 0) {
        local_4d8 = (double *)(ulong)(uint)local_50c.smallend.vect[2];
        if (local_50c.smallend.vect[2] <= local_50c.bigend.vect[2]) {
          dVar78 = local_488->m_const_sigma;
          local_498 = (int *)(ulong)(uint)local_50c.smallend.vect[1];
          lVar51 = (long)local_50c.smallend.vect[0] * 8;
          iVar30 = local_50c.smallend.vect[2] - 1;
          uVar31 = local_50c.smallend.vect[2];
          do {
            uVar31 = uVar31 + 1;
            if (local_50c.smallend.vect[1] <= local_50c.bigend.vect[1]) {
              lVar50 = (long)(int)(uint)local_4d8;
              local_5e8 = local_498;
              iVar1 = local_50c.smallend.vect[1] - 1;
              uVar32 = local_50c.smallend.vect[1];
              do {
                uVar32 = uVar32 + 1;
                if (local_50c.smallend.vect[0] <= local_50c.bigend.vect[0]) {
                  lVar58 = (long)(int)(uint)local_5e8;
                  lVar65 = (int)((uint)local_4d8 - local_340.begin.z) * local_340.kstride;
                  lVar62 = (int)(~local_340.begin.z + (uint)local_4d8) * local_340.kstride;
                  lVar53 = (int)(((uint)local_4d8 + 1) - local_340.begin.z) * local_340.kstride;
                  lVar40 = local_340.kstride * 8;
                  lVar55 = (lVar50 - local_340.begin.z) * lVar40;
                  lVar41 = (int)(uVar31 - local_340.begin.z) * lVar40;
                  lVar40 = (iVar30 - local_340.begin.z) * lVar40;
                  lVar63 = local_340.jstride * (int)((uint)local_5e8 - local_340.begin.y);
                  lVar36 = (int)(~local_340.begin.y + (uint)local_5e8) * local_340.jstride;
                  lVar45 = (int)(((uint)local_5e8 - local_340.begin.y) + 1) * local_340.jstride;
                  lVar44 = local_340.jstride * 8;
                  lVar49 = (int)(uVar32 - local_340.begin.y) * lVar44;
                  lVar66 = (iVar1 - local_340.begin.y) * lVar44;
                  lVar44 = (lVar58 - local_340.begin.y) * lVar44;
                  lVar46 = (long)local_340.begin.x;
                  lVar67 = 0;
                  do {
                    dVar74 = 0.0;
                    if (*(int *)((long)local_3c0.p +
                                lVar67 * 4 +
                                (lVar58 - local_3c0.begin.y) * local_3c0.jstride * 4 +
                                (lVar50 - local_3c0.begin.z) * local_3c0.kstride * 4 +
                                (long)local_3c0.begin.x * -4 + (long)local_50c.smallend.vect[0] * 4)
                        == 0) {
                      lVar59 = (long)(((local_50c.smallend.vect[0] + -1) - local_340.begin.x) +
                                     (int)lVar67);
                      lVar42 = (long)((local_50c.smallend.vect[0] - local_340.begin.x) + 1 +
                                     (int)lVar67);
                      dVar74 = *(double *)
                                ((long)local_340.p +
                                lVar67 * 8 + lVar66 + lVar40 + lVar46 * -8 + lVar51);
                      dVar3 = *(double *)
                               ((long)local_340.p +
                               lVar67 * 8 + lVar49 + lVar40 + lVar46 * -8 + lVar51);
                      dVar4 = *(double *)
                               ((long)local_340.p +
                               lVar67 * 8 + lVar41 + lVar66 + lVar46 * -8 + lVar51);
                      dVar5 = *(double *)
                               ((long)local_340.p +
                               lVar67 * 8 + lVar41 + lVar49 + lVar46 * -8 + lVar51);
                      dVar74 = ((*(double *)
                                  ((long)local_340.p +
                                  lVar67 * 8 + lVar40 + lVar44 + lVar46 * -8 + lVar51) * 4.0 +
                                *(double *)
                                 ((long)local_340.p +
                                 lVar67 * 8 + lVar41 + lVar44 + lVar46 * -8 + lVar51) * 4.0) *
                                local_1c8 +
                               (*(double *)
                                 ((long)local_340.p +
                                 lVar67 * 8 + lVar55 + lVar66 + lVar46 * -8 + lVar51) * 4.0 +
                               *(double *)
                                ((long)local_340.p +
                                lVar67 * 8 + lVar55 + lVar49 + lVar46 * -8 + lVar51) * 4.0) *
                               local_1b8 +
                               (local_340.p[lVar63 + lVar59 + lVar65] * 4.0 +
                               local_340.p[lVar63 + lVar42 + lVar65] * 4.0) * local_1a8 +
                               (local_340.p[lVar45 + lVar42 + lVar65] +
                                local_340.p[lVar45 + lVar42 + lVar65] +
                               local_340.p[lVar45 + lVar59 + lVar65] +
                               local_340.p[lVar45 + lVar59 + lVar65] +
                               local_340.p[lVar36 + lVar59 + lVar65] +
                               local_340.p[lVar36 + lVar59 + lVar65] +
                               local_340.p[lVar36 + lVar42 + lVar65] +
                               local_340.p[lVar36 + lVar42 + lVar65]) * local_1e8 +
                               (local_340.p[lVar63 + lVar42 + lVar53] +
                                local_340.p[lVar63 + lVar42 + lVar53] +
                               local_340.p[lVar63 + lVar59 + lVar53] +
                               local_340.p[lVar63 + lVar59 + lVar53] +
                               local_340.p[lVar63 + lVar59 + lVar62] +
                               local_340.p[lVar63 + lVar59 + lVar62] +
                               local_340.p[lVar63 + lVar42 + lVar62] +
                               local_340.p[lVar63 + lVar42 + lVar62]) * local_1d8 +
                               (dVar5 + dVar5 + dVar4 + dVar4 + dVar74 + dVar74 + dVar3 + dVar3) *
                               local_198 +
                               *(double *)
                                ((long)local_340.p +
                                lVar67 * 8 + lVar44 + lVar55 + lVar46 * -8 + lVar51) * -4.0 *
                               local_188 * 8.0 +
                               (local_340.p[lVar36 + lVar59 + lVar62] +
                                local_340.p[lVar36 + lVar42 + lVar62] +
                                local_340.p[lVar45 + lVar59 + lVar62] +
                                local_340.p[lVar45 + lVar42 + lVar62] +
                                local_340.p[lVar36 + lVar59 + lVar53] +
                                local_340.p[lVar36 + lVar42 + lVar53] +
                                local_340.p[lVar45 + lVar59 + lVar53] +
                               local_340.p[lVar45 + lVar42 + lVar53]) * local_188) * dVar78;
                    }
                    *(double *)
                     ((long)local_380.p +
                     lVar67 * 8 +
                     (lVar58 - local_380.begin.y) * local_380.jstride * 8 +
                     (lVar50 - local_380.begin.z) * local_380.kstride * 8 +
                     (long)local_380.begin.x * -8 + lVar51) = dVar74;
                    lVar67 = lVar67 + 1;
                  } while ((local_50c.bigend.vect[0] - local_50c.smallend.vect[0]) + 1 !=
                           (int)lVar67);
                }
                iVar1 = iVar1 + 1;
                bVar68 = (uint)local_5e8 != local_50c.bigend.vect[1];
                local_5e8 = (int *)(ulong)((uint)local_5e8 + 1);
              } while (bVar68);
            }
            uVar32 = (uint)local_4d8 + 1;
            iVar30 = iVar30 + 1;
            bVar68 = (uint)local_4d8 != local_50c.bigend.vect[2];
            local_4d8 = (double *)(ulong)uVar32;
          } while (bVar68);
        }
      }
      else if (((local_3e0 < 1) || (local_488->m_use_harmonic_average == false)) &&
              (local_488->m_use_mapped != true)) {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_2f8,(FabArray<amrex::FArrayBox> *)*local_468,&local_90);
        local_4b8 = CONCAT44(local_4b8._4_4_,local_50c.bigend.vect[2]);
        if (local_50c.smallend.vect[2] <= local_50c.bigend.vect[2]) {
          lVar50 = (long)local_50c.smallend.vect[0];
          lVar51 = lVar50 * 8;
          iVar30 = local_50c.smallend.vect[2] - 1;
          local_4e0 = CONCAT44(local_4e0._4_4_,local_50c.smallend.vect[1] - 1U);
          local_4e8 = CONCAT44(local_4e8._4_4_,local_50c.smallend.vect[1] + 1U);
          local_4c0 = lVar50 * 4;
          uVar31 = local_50c.smallend.vect[2];
          uVar32 = local_50c.smallend.vect[2];
          do {
            uVar32 = uVar32 + 1;
            if (local_50c.smallend.vect[1] <= local_50c.bigend.vect[1]) {
              lVar45 = (long)(int)uVar31;
              local_4d8 = local_380.p +
                          lVar50 + ((lVar45 - local_380.begin.z) * local_380.kstride -
                                   (long)local_380.begin.x);
              local_498 = local_3c0.p +
                          lVar50 + ((lVar45 - local_3c0.begin.z) * local_3c0.kstride -
                                   (long)local_3c0.begin.x);
              uVar28 = local_50c.smallend.vect[1];
              iVar2 = local_50c.smallend.vect[1] + 1U;
              iVar1 = local_50c.smallend.vect[1] - 1U;
              do {
                if (local_50c.smallend.vect[0] <= local_50c.bigend.vect[0]) {
                  lVar59 = (long)(int)uVar28;
                  lVar66 = (long)local_2f8.begin.x;
                  lVar58 = (lVar45 - local_2f8.begin.z) * local_2f8.kstride * 8;
                  lVar63 = ((long)iVar30 - (long)local_2f8.begin.z) * local_2f8.kstride * 8;
                  lVar53 = (lVar59 - local_2f8.begin.y) * local_2f8.jstride * 8;
                  lVar65 = ((long)iVar1 - (long)local_2f8.begin.y) * local_2f8.jstride * 8;
                  lVar49 = lVar58 + lVar53 + lVar66 * -8 + lVar51;
                  lVar53 = lVar53 + lVar63 + lVar66 * -8 + lVar51;
                  lVar58 = lVar58 + lVar65 + lVar66 * -8 + lVar51;
                  lVar63 = lVar65 + lVar63 + lVar66 * -8 + lVar51;
                  lVar36 = (int)(uVar31 - local_340.begin.z) * local_340.kstride;
                  lVar47 = (int)((uVar31 - 1) - local_340.begin.z) * local_340.kstride;
                  lVar33 = (int)((uVar31 + 1) - local_340.begin.z) * local_340.kstride;
                  lVar41 = local_340.kstride * 8;
                  lVar55 = (lVar45 - local_340.begin.z) * lVar41;
                  lVar67 = (int)(uVar32 - local_340.begin.z) * lVar41;
                  lVar41 = ((long)iVar30 - (long)local_340.begin.z) * lVar41;
                  iVar37 = uVar28 - local_340.begin.y;
                  lVar42 = local_340.jstride * iVar37;
                  lVar43 = (iVar37 + -1) * local_340.jstride;
                  lVar38 = (iVar37 + 1) * local_340.jstride;
                  lVar35 = local_340.jstride * 8;
                  lVar62 = (lVar59 - local_340.begin.y) * lVar35;
                  lVar46 = (iVar2 - local_340.begin.y) * lVar35;
                  lVar35 = ((long)iVar1 - (long)local_340.begin.y) * lVar35;
                  lVar34 = (long)local_340.begin.x;
                  lVar66 = lVar55 + lVar62 + lVar34 * -8 + lVar51;
                  lVar65 = lVar62 + lVar67 + lVar34 * -8 + lVar51;
                  lVar62 = lVar62 + lVar41 + lVar34 * -8 + lVar51;
                  lVar40 = lVar55 + lVar46 + lVar34 * -8 + lVar51;
                  lVar44 = lVar67 + lVar46 + lVar34 * -8 + lVar51;
                  lVar46 = lVar46 + lVar41 + lVar34 * -8 + lVar51;
                  lVar55 = lVar55 + lVar35 + lVar34 * -8 + lVar51;
                  lVar67 = lVar67 + lVar35 + lVar34 * -8 + lVar51;
                  lVar41 = lVar35 + lVar41 + lVar34 * -8 + lVar51;
                  lVar34 = 0;
                  do {
                    dVar78 = 0.0;
                    if (*(int *)((long)local_498 +
                                lVar34 * 4 + (lVar59 - local_3c0.begin.y) * local_3c0.jstride * 4)
                        == 0) {
                      dVar78 = *(double *)((long)local_2f8.p + lVar34 * 8 + lVar63 + -8);
                      dVar74 = *(double *)((long)local_2f8.p + lVar34 * 8 + lVar63);
                      dVar75 = dVar78 + dVar74;
                      dVar3 = *(double *)((long)local_2f8.p + lVar34 * 8 + lVar53 + -8);
                      dVar4 = *(double *)((long)local_2f8.p + lVar34 * 8 + lVar53);
                      dVar72 = dVar75 + dVar3 + dVar4;
                      dVar5 = *(double *)((long)local_2f8.p + lVar34 * 8 + lVar58 + -8);
                      dVar6 = *(double *)((long)local_2f8.p + lVar34 * 8 + lVar58);
                      dVar7 = *(double *)((long)local_2f8.p + lVar34 * 8 + lVar49 + -8);
                      dVar8 = *(double *)((long)local_2f8.p + lVar34 * 8 + lVar49);
                      lVar35 = (long)(((local_50c.smallend.vect[0] + 1) - local_340.begin.x) +
                                     (int)lVar34);
                      dVar78 = (dVar72 * *(double *)((long)local_340.p + lVar34 * 8 + lVar62) +
                               (dVar5 + dVar6 + dVar7 + dVar8) *
                               *(double *)((long)local_340.p + lVar34 * 8 + lVar65)) * local_1c8 +
                               ((dVar75 + dVar5 + dVar6) *
                                *(double *)((long)local_340.p + lVar34 * 8 + lVar55) +
                               (dVar3 + dVar4 + dVar7 + dVar8) *
                               *(double *)((long)local_340.p + lVar34 * 8 + lVar40)) * local_1b8 +
                               ((dVar78 + dVar3 + dVar5 + dVar7) *
                                *(double *)((long)local_340.p + lVar34 * 8 + lVar66 + -8) +
                               (dVar74 + dVar4 + dVar6 + dVar8) *
                               local_340.p[lVar42 + lVar35 + lVar36]) * local_1a8 +
                               ((dVar4 + dVar8) * local_340.p[lVar38 + lVar35 + lVar36] +
                               (dVar3 + dVar7) *
                               *(double *)((long)local_340.p + lVar34 * 8 + lVar40 + -8) +
                               (dVar78 + dVar5) *
                               *(double *)((long)local_340.p + lVar34 * 8 + lVar55 + -8) +
                               (dVar74 + dVar6) * local_340.p[lVar43 + lVar35 + lVar36]) * local_1e8
                               + ((dVar6 + dVar8) * local_340.p[lVar42 + lVar35 + lVar33] +
                                 (dVar5 + dVar7) *
                                 *(double *)((long)local_340.p + lVar34 * 8 + lVar65 + -8) +
                                 *(double *)((long)local_340.p + lVar34 * 8 + lVar62 + -8) *
                                 (dVar78 + dVar3) +
                                 local_340.p[lVar42 + lVar35 + lVar47] * (dVar74 + dVar4)) *
                                 local_1d8 +
                                 ((dVar7 + dVar8) *
                                  *(double *)((long)local_340.p + lVar34 * 8 + lVar44) +
                                 *(double *)((long)local_340.p + lVar34 * 8 + lVar67) *
                                 (dVar5 + dVar6) +
                                 *(double *)((long)local_340.p + lVar34 * 8 + lVar41) * dVar75 +
                                 *(double *)((long)local_340.p + lVar34 * 8 + lVar46) *
                                 (dVar3 + dVar4)) * local_198 +
                                 (local_340.p[lVar38 + lVar35 + lVar33] * dVar8 +
                                 *(double *)((long)local_340.p + lVar34 * 8 + lVar44 + -8) * dVar7 +
                                 local_340.p[lVar43 + lVar35 + lVar33] * dVar6 +
                                 *(double *)((long)local_340.p + lVar34 * 8 + lVar67 + -8) * dVar5 +
                                 local_340.p[lVar38 + lVar35 + lVar47] * dVar4 +
                                 *(double *)((long)local_340.p + lVar34 * 8 + lVar46 + -8) * dVar3 +
                                 *(double *)((long)local_340.p + lVar34 * 8 + lVar41 + -8) * dVar78
                                 + local_340.p[lVar43 + lVar35 + lVar47] * dVar74) * local_188 +
                                 (dVar72 + dVar5 + dVar6 + dVar7 + dVar8) *
                                 *(double *)((long)local_340.p + lVar34 * 8 + lVar66) * -4.0 *
                                 local_188;
                    }
                    *(double *)
                     ((long)local_4d8 +
                     lVar34 * 8 + (lVar59 - local_380.begin.y) * local_380.jstride * 8) = dVar78;
                    lVar34 = lVar34 + 1;
                  } while ((local_50c.bigend.vect[0] - local_50c.smallend.vect[0]) + 1 !=
                           (int)lVar34);
                }
                iVar1 = iVar1 + 1;
                iVar2 = iVar2 + 1;
                bVar68 = uVar28 != local_50c.bigend.vect[1];
                uVar28 = uVar28 + 1;
              } while (bVar68);
            }
            iVar30 = iVar30 + 1;
            bVar68 = uVar31 != local_50c.bigend.vect[2];
            uVar31 = uVar31 + 1;
          } while (bVar68);
        }
      }
      else {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_2f8,(FabArray<amrex::FArrayBox> *)*local_468,&local_90);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_d0,(FabArray<amrex::FArrayBox> *)plVar29[1],&local_90);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_110,(FabArray<amrex::FArrayBox> *)plVar29[2],&local_90);
        local_3d4 = local_50c.bigend.vect[2];
        local_480 = (ulong)(uint)local_50c.smallend.vect[2];
        if (local_50c.smallend.vect[2] <= local_50c.bigend.vect[2]) {
          local_300 = (ulong)(uint)local_50c.smallend.vect[1];
          local_4a4 = local_50c.bigend.vect[1];
          local_218 = (long)local_50c.smallend.vect[0];
          local_3d0 = local_50c.smallend.vect[0] + 1;
          local_460 = local_218 * 8;
          local_4ac = local_50c.smallend.vect[2] - 1;
          local_3d8 = local_50c.smallend.vect[1] - 1;
          local_4a8 = local_50c.smallend.vect[2] + 1;
          local_3dc = local_50c.smallend.vect[1] + 1;
          local_3c4 = local_50c.bigend.vect[0];
          local_260 = local_218 * 4;
          do {
            if (local_50c.smallend.vect[1] <= local_50c.bigend.vect[1]) {
              local_220 = (long)(int)(uint)local_480;
              local_228 = (long)local_4ac;
              local_3c8 = (uint)local_480 - 1;
              local_3cc = (uint)local_480 + 1;
              local_250 = local_380.p +
                          local_218 +
                          ((local_220 - local_380.begin.z) * local_380.kstride -
                          (long)local_380.begin.x);
              local_248 = local_380.jstride * 8;
              local_240 = -(long)local_380.begin.y;
              local_258 = local_3c0.p +
                          local_218 +
                          ((local_220 - local_3c0.begin.z) * local_3c0.kstride -
                          (long)local_3c0.begin.x);
              local_238 = local_3c0.jstride * 4;
              local_230 = -(long)local_3c0.begin.y;
              local_4a0 = local_3d8;
              local_49c = local_3dc;
              local_458 = local_300;
              do {
                if (local_50c.smallend.vect[0] <= local_50c.bigend.vect[0]) {
                  lVar63 = (long)(int)(uint)local_458;
                  lVar49 = (long)local_4a0;
                  lVar53 = (long)local_d0.begin.x;
                  lVar58 = (long)local_110.begin.x;
                  lVar51 = (local_220 - local_110.begin.z) * local_110.kstride * 8;
                  lVar66 = (local_228 - local_110.begin.z) * local_110.kstride * 8;
                  lVar50 = (lVar63 - local_110.begin.y) * local_110.jstride * 8;
                  lVar45 = (lVar49 - local_110.begin.y) * local_110.jstride * 8;
                  local_3e8 = (long)local_110.p + lVar51 + lVar50 + lVar58 * -8 + local_460;
                  local_4e8 = (long)local_110.p + lVar50 + lVar66 + lVar58 * -8 + local_460;
                  local_4e0 = (long)local_110.p + lVar51 + lVar45 + lVar58 * -8 + local_460;
                  local_4c0 = (long)local_110.p + lVar45 + lVar66 + lVar58 * -8 + local_460;
                  lVar51 = (local_220 - local_d0.begin.z) * local_d0.kstride * 8;
                  lVar58 = (local_228 - local_d0.begin.z) * local_d0.kstride * 8;
                  lVar50 = (lVar63 - local_d0.begin.y) * local_d0.jstride * 8;
                  lVar45 = (lVar49 - local_d0.begin.y) * local_d0.jstride * 8;
                  local_408 = (long)local_d0.p + lVar51 + lVar50 + lVar53 * -8 + local_460;
                  local_3f8 = (long)local_d0.p + lVar50 + lVar58 + lVar53 * -8 + local_460;
                  local_3f0 = (long)local_d0.p + lVar51 + lVar45 + lVar53 * -8 + local_460;
                  local_400 = (long)local_d0.p + lVar45 + lVar58 + lVar53 * -8 + local_460;
                  lVar50 = (local_220 - local_2f8.begin.z) * local_2f8.kstride * 8;
                  lVar53 = (local_228 - local_2f8.begin.z) * local_2f8.kstride * 8;
                  lVar45 = (lVar63 - local_2f8.begin.y) * local_2f8.jstride * 8;
                  lVar58 = (lVar49 - local_2f8.begin.y) * local_2f8.jstride * 8;
                  lVar51 = (long)local_2f8.begin.x;
                  local_428 = (int *)((long)local_2f8.p + lVar50 + lVar45 + lVar51 * -8 + local_460)
                  ;
                  local_418 = (long)local_2f8.p + lVar45 + lVar53 + lVar51 * -8 + local_460;
                  local_410 = (long)local_2f8.p + lVar50 + lVar58 + lVar51 * -8 + local_460;
                  local_420 = (double *)
                              ((long)local_2f8.p + lVar58 + lVar53 + lVar51 * -8 + local_460);
                  local_448 = (int)((uint)local_480 - local_340.begin.z) * local_340.kstride;
                  local_1f0 = (local_3c8 - local_340.begin.z) * local_340.kstride;
                  lVar50 = (local_3cc - local_340.begin.z) * local_340.kstride;
                  lVar58 = local_340.kstride * 8;
                  lVar65 = (local_220 - local_340.begin.z) * lVar58;
                  lVar45 = (local_4a8 - local_340.begin.z) * lVar58;
                  lVar58 = (local_228 - local_340.begin.z) * lVar58;
                  iVar30 = (uint)local_458 - local_340.begin.y;
                  lVar53 = local_340.jstride * 8;
                  lVar66 = (lVar63 - local_340.begin.y) * lVar53;
                  lVar51 = (local_49c - local_340.begin.y) * lVar53;
                  lVar53 = (lVar49 - local_340.begin.y) * lVar53;
                  lVar49 = (long)local_340.begin.x;
                  local_1f8 = (ulong)(uint)(local_3d0 - local_340.begin.x);
                  local_200 = local_340.p + local_340.jstride * iVar30;
                  local_208 = local_340.p + (iVar30 + -1) * local_340.jstride;
                  local_210 = local_340.p + (iVar30 + 1) * local_340.jstride;
                  local_430 = (long)local_340.p + lVar65 + lVar66 + lVar49 * -8 + local_460;
                  local_4f0 = (long)local_340.p + lVar66 + lVar45 + lVar49 * -8 + local_460;
                  local_4b8 = (long)local_340.p + lVar66 + lVar58 + lVar49 * -8 + local_460;
                  local_478 = (long)local_340.p + lVar65 + lVar51 + lVar49 * -8 + local_460;
                  local_450 = (long)local_340.p + lVar45 + lVar51 + lVar49 * -8 + local_460;
                  lVar51 = lVar51 + lVar58 + lVar49 * -8 + local_460;
                  local_438 = (long)local_340.p + lVar65 + lVar53 + lVar49 * -8 + local_460;
                  local_440 = (long)local_340.p + lVar45 + lVar53 + lVar49 * -8 + local_460;
                  local_470 = (long)local_340.p + lVar53 + lVar58 + lVar49 * -8 + local_460;
                  lVar45 = 0;
                  do {
                    dVar78 = 0.0;
                    if (*(int *)((long)local_258 + lVar45 * 4 + (local_230 + lVar63) * local_238) ==
                        0) {
                      dVar78 = local_420[lVar45 + -1];
                      dVar74 = local_420[lVar45];
                      dVar69 = dVar78 + dVar74;
                      dVar3 = *(double *)(local_418 + -8 + lVar45 * 8);
                      dVar4 = *(double *)(local_418 + lVar45 * 8);
                      dVar73 = dVar69 + dVar3 + dVar4;
                      dVar5 = *(double *)(local_410 + -8 + lVar45 * 8);
                      dVar6 = *(double *)(local_410 + lVar45 * 8);
                      dVar7 = *(double *)(local_428 + lVar45 * 2 + -2);
                      dVar8 = *(double *)(local_428 + lVar45 * 2);
                      dVar72 = *(double *)(local_400 + -8 + lVar45 * 8);
                      dVar75 = *(double *)(local_400 + lVar45 * 8);
                      dVar76 = dVar72 + dVar75;
                      dVar9 = *(double *)(local_3f8 + -8 + lVar45 * 8);
                      dVar10 = *(double *)(local_3f8 + lVar45 * 8);
                      dVar70 = dVar76 + dVar9 + dVar10;
                      dVar11 = *(double *)(local_3f0 + -8 + lVar45 * 8);
                      dVar12 = *(double *)(local_3f0 + lVar45 * 8);
                      dVar13 = *(double *)(local_408 + -8 + lVar45 * 8);
                      dVar14 = *(double *)(local_408 + lVar45 * 8);
                      dVar15 = *(double *)(local_4c0 + -8 + lVar45 * 8);
                      dVar16 = *(double *)(local_4c0 + lVar45 * 8);
                      dVar77 = dVar15 + dVar16;
                      dVar17 = *(double *)(local_4e8 + -8 + lVar45 * 8);
                      dVar18 = *(double *)(local_4e8 + lVar45 * 8);
                      dVar71 = dVar77 + dVar17 + dVar18;
                      dVar19 = *(double *)(local_4e0 + -8 + lVar45 * 8);
                      dVar20 = *(double *)(local_4e0 + lVar45 * 8);
                      dVar21 = *(double *)(local_3e8 + -8 + lVar45 * 8);
                      dVar22 = *(double *)(local_3e8 + lVar45 * 8);
                      lVar49 = (long)((local_3d0 - local_340.begin.x) + (int)lVar45);
                      local_4d8 = (double *)
                                  ((local_128 * dVar22 + local_138 * dVar8 + local_148 * dVar14) *
                                   local_210[lVar49 + lVar50] +
                                   (local_128 * dVar21 + local_138 * dVar7 + local_148 * dVar13) *
                                   *(double *)(local_450 + -8 + lVar45 * 8) +
                                   (local_128 * dVar20 + local_138 * dVar6 + local_148 * dVar12) *
                                   local_208[lVar49 + lVar50] +
                                   (local_128 * dVar19 + local_138 * dVar5 + local_148 * dVar11) *
                                   *(double *)(local_440 + -8 + lVar45 * 8) +
                                   (local_128 * dVar18 + local_138 * dVar4 + local_148 * dVar10) *
                                   local_210[lVar49 + local_1f0] +
                                   (local_128 * dVar17 + local_138 * dVar3 + local_148 * dVar9) *
                                   *(double *)((long)local_340.p + lVar45 * 8 + lVar51 + -8) +
                                   (local_128 * dVar15 + local_138 * dVar78 + local_148 * dVar72) *
                                   *(double *)((local_470 - 8) + lVar45 * 8) +
                                   (local_128 * dVar16 + local_138 * dVar74 + local_148 * dVar75) *
                                   local_208[lVar49 + local_1f0] +
                                  ((dVar71 + dVar19 + dVar20 + dVar21 + dVar22) * local_128 +
                                  (dVar73 + dVar5 + dVar6 + dVar7 + dVar8) * local_138 +
                                  (dVar70 + dVar11 + dVar12 + dVar13 + dVar14) * local_148) *
                                  *(double *)(local_430 + lVar45 * 8) * -4.0);
                      uStack_4d0 = uStack_120;
                      local_498 = (int *)((local_2b8 * dVar77 +
                                          local_298 * dVar69 + local_2a8 * dVar76) *
                                          *(double *)(local_470 + lVar45 * 8) +
                                         (local_2b8 * (dVar17 + dVar18) +
                                         local_298 * (dVar3 + dVar4) + local_2a8 * (dVar9 + dVar10))
                                         * *(double *)((long)local_340.p + lVar45 * 8 + lVar51));
                      uStack_490 = uStack_2b0;
                      dVar23 = *(double *)(local_430 + -8 + lVar45 * 8);
                      dVar24 = *(double *)(local_438 + lVar45 * 8);
                      dVar25 = *(double *)(local_478 + lVar45 * 8);
                      dVar26 = *(double *)(local_4b8 + lVar45 * 8);
                      dVar27 = *(double *)(local_4f0 + lVar45 * 8);
                      dVar78 = ((dVar19 + dVar20 + dVar21 + dVar22) * local_2b8 +
                               (dVar5 + dVar6 + dVar7 + dVar8) * local_298 +
                               (dVar11 + dVar12 + dVar13 + dVar14) * local_168) * (dVar27 + dVar27)
                               + (dVar71 * local_2b8 + dVar73 * local_298 + dVar70 * local_168) *
                                 (dVar26 + dVar26) +
                                 ((dVar17 + dVar18 + dVar21 + dVar22) * local_158 +
                                 (dVar3 + dVar4 + dVar7 + dVar8) * local_298 +
                                 (dVar9 + dVar10 + dVar13 + dVar14) * local_2a8) * (dVar25 + dVar25)
                                 + ((dVar77 + dVar19 + dVar20) * local_158 +
                                   (dVar69 + dVar5 + dVar6) * local_298 +
                                   (dVar76 + dVar11 + dVar12) * local_2a8) * (dVar24 + dVar24) +
                                   ((dVar16 + dVar18 + dVar20 + dVar22) * local_158 +
                                   (dVar74 + dVar4 + dVar6 + dVar8) * local_178 +
                                   (dVar75 + dVar10 + dVar12 + dVar14) * local_168) *
                                   (local_200[lVar49 + local_448] + local_200[lVar49 + local_448]) +
                                   ((dVar15 + dVar17 + dVar19 + dVar21) * local_158 +
                                   (dVar78 + dVar3 + dVar5 + dVar7) * local_178 +
                                   (dVar72 + dVar9 + dVar11 + dVar13) * local_168) *
                                   (dVar23 + dVar23) +
                               ((dVar18 + dVar22) * local_158 +
                               (dVar4 + dVar8) * local_178 + (dVar10 + dVar14) * local_2a8) *
                               local_210[lVar49 + local_448] +
                               ((dVar17 + dVar21) * local_158 +
                               (dVar3 + dVar7) * local_178 + (dVar9 + dVar13) * local_2a8) *
                               *(double *)(local_478 + -8 + lVar45 * 8) +
                               ((dVar16 + dVar20) * local_158 +
                               (dVar74 + dVar6) * local_178 + (dVar75 + dVar12) * local_2a8) *
                               local_208[lVar49 + local_448] +
                               ((dVar15 + dVar19) * local_158 +
                               (dVar78 + dVar5) * local_178 + (dVar72 + dVar11) * local_2a8) *
                               *(double *)(local_438 + -8 + lVar45 * 8) +
                               ((dVar20 + dVar22) * local_2b8 +
                               (dVar6 + dVar8) * local_178 + (dVar12 + dVar14) * local_168) *
                               local_200[lVar49 + lVar50] +
                               ((dVar19 + dVar21) * local_2b8 +
                               (dVar5 + dVar7) * local_178 + (dVar11 + dVar13) * local_168) *
                               *(double *)((local_4f0 - 8) + lVar45 * 8) +
                               (local_2b8 * (dVar16 + dVar18) +
                               local_178 * (dVar74 + dVar4) + (dVar75 + dVar10) * local_168) *
                               local_200[lVar49 + local_1f0] +
                               (local_2b8 * (dVar15 + dVar17) +
                               local_178 * (dVar78 + dVar3) + (dVar72 + dVar9) * local_168) *
                               *(double *)(local_4b8 + -8 + lVar45 * 8) +
                               ((dVar21 + dVar22) * local_2b8 +
                               (dVar7 + dVar8) * local_298 + (dVar13 + dVar14) * local_2a8) *
                               *(double *)(local_450 + lVar45 * 8) +
                               (local_2b8 * (dVar19 + dVar20) +
                               local_298 * (dVar5 + dVar6) + local_2a8 * (dVar11 + dVar12)) *
                               *(double *)(local_440 + lVar45 * 8) + (double)local_498 +
                               (double)local_4d8;
                    }
                    *(double *)((long)local_250 + lVar45 * 8 + (local_240 + lVar63) * local_248) =
                         dVar78;
                    lVar45 = lVar45 + 1;
                  } while ((local_50c.bigend.vect[0] - local_50c.smallend.vect[0]) + 1 !=
                           (int)lVar45);
                }
                uVar31 = (uint)local_458 + 1;
                local_4a0 = local_4a0 + 1;
                local_49c = local_49c + 1;
                bVar68 = (uint)local_458 != local_50c.bigend.vect[1];
                local_458 = (ulong)uVar31;
              } while (bVar68);
            }
            uVar31 = (uint)local_480 + 1;
            local_4ac = local_4ac + 1;
            local_4a8 = local_4a8 + 1;
            bVar68 = (uint)local_480 != local_50c.bigend.vect[2];
            local_480 = (ulong)uVar31;
          } while (bVar68);
        }
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MLNodeLaplacian::Fapply (int amrlev, int mglev, MultiFab& out, const MultiFab& in) const
{
    BL_PROFILE("MLNodeLaplacian::Fapply()");

    const auto& sigma = m_sigma[amrlev][mglev];
    const auto& stencil = m_stencil[amrlev][mglev];
    const auto dxinvarr = m_geom[amrlev][mglev].InvCellSizeArray();
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][mglev];


#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto xarr_ma = in.const_arrays();
        auto yarr_ma = out.arrays();
        auto dmskarr_ma = dmsk.const_arrays();

        if (m_coarsening_strategy == CoarseningStrategy::RAP)
        {
            auto stenarr_ma = stencil->const_arrays();
            ParallelFor(out, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_sten(i,j,k,xarr_ma[box_no],stenarr_ma[box_no],dmskarr_ma[box_no]);
            });
        }
        else if (sigma[0] == nullptr)
        {
            Real const_sigma = m_const_sigma;
            ParallelFor(out, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
#if (AMREX_SPACEDIM == 2)
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_c(i,j,k,xarr_ma[box_no],const_sigma,dmskarr_ma[box_no], is_rz, dxinvarr);
#else
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_c(i,j,k,xarr_ma[box_no],const_sigma,dmskarr_ma[box_no], dxinvarr);
#endif
            });
        }
        else if ( (m_use_harmonic_average && mglev > 0) ||
                   m_use_mapped )
        {
            AMREX_D_TERM(MultiArray4<Real const> const& sxarr_ma = sigma[0]->const_arrays();,
                         MultiArray4<Real const> const& syarr_ma = sigma[1]->const_arrays();,
                         MultiArray4<Real const> const& szarr_ma = sigma[2]->const_arrays(););
            ParallelFor(out, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
#if (AMREX_SPACEDIM == 2)
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_ha(i,j,k,xarr_ma[box_no],AMREX_D_DECL(sxarr_ma[box_no],syarr_ma[box_no],szarr_ma[box_no]), dmskarr_ma[box_no],
                                               is_rz, dxinvarr);
#else
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_ha(i,j,k,xarr_ma[box_no],AMREX_D_DECL(sxarr_ma[box_no],syarr_ma[box_no],szarr_ma[box_no]), dmskarr_ma[box_no],
                                               dxinvarr);
#endif
            });
        }
        else
        {
            auto sarr_ma = sigma[0]->const_arrays();
            ParallelFor(out, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
#if (AMREX_SPACEDIM == 2)
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_aa(i,j,k,xarr_ma[box_no],sarr_ma[box_no],dmskarr_ma[box_no], is_rz, dxinvarr);
#else
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_aa(i,j,k,xarr_ma[box_no],sarr_ma[box_no],dmskarr_ma[box_no], dxinvarr);
#endif
            });
        }
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(out,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real const> const& xarr = in.const_array(mfi);
            Array4<Real> const& yarr = out.array(mfi);
            Array4<int const> const& dmskarr = dmsk.const_array(mfi);

            if (m_coarsening_strategy == CoarseningStrategy::RAP)
            {
                Array4<Real const> const& stenarr = stencil->const_array(mfi);
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_sten(i,j,k,xarr,stenarr,dmskarr);
                });
            }
            else if (sigma[0] == nullptr)
            {
                Real const_sigma = m_const_sigma;
#if (AMREX_SPACEDIM == 2)
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_c(i,j,k,xarr,const_sigma,dmskarr, is_rz, dxinvarr);
                });
#else
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_c(i,j,k,xarr,const_sigma,dmskarr, dxinvarr);
                });
#endif
            }
            else if ( (m_use_harmonic_average && mglev > 0) ||
                       m_use_mapped )
            {
                AMREX_D_TERM(Array4<Real const> const& sxarr = sigma[0]->const_array(mfi);,
                             Array4<Real const> const& syarr = sigma[1]->const_array(mfi);,
                             Array4<Real const> const& szarr = sigma[2]->const_array(mfi););
#if (AMREX_SPACEDIM == 2)
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_ha(i,j,k,xarr,AMREX_D_DECL(sxarr,syarr,szarr), dmskarr,
                                                   is_rz, dxinvarr);
                });
#else
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_ha(i,j,k,xarr,AMREX_D_DECL(sxarr,syarr,szarr), dmskarr,
                                                   dxinvarr);
                });
#endif
            }
            else
            {
                Array4<Real const> const& sarr = sigma[0]->const_array(mfi);
#if (AMREX_SPACEDIM == 2)
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_aa(i,j,k,xarr,sarr,dmskarr, is_rz, dxinvarr);
                });
#else
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_aa(i,j,k,xarr,sarr,dmskarr, dxinvarr);
                });
#endif
           }
        }
    }
}